

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void __thiscall ast::Section::write8(Section *this,uint offset,uint8_t value)

{
  uint new_capacity;
  
  new_capacity = offset + 1;
  if (this->content_capacity < new_capacity) {
    enlarge(this,new_capacity);
  }
  this->content[offset] = value;
  if (this->content_size < new_capacity) {
    this->content_size = new_capacity;
  }
  return;
}

Assistant:

void Section::write8(unsigned offset, uint8_t value)
{
	auto limit_superior = offset + 1;
	if (limit_superior > content_capacity)
		enlarge(limit_superior);
	content[offset] = value;
	if (limit_superior > content_size)
		content_size = offset + 1;
}